

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall pbrt::ParsedScene::Option(ParsedScene *this,string *name,string *value,FileLoc loc)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  ulong in_RDX;
  char (*in_RDI) [7];
  string nName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff41;
  undefined1 in_stack_ffffffffffffff42;
  undefined1 in_stack_ffffffffffffff43;
  undefined1 in_stack_ffffffffffffff44;
  undefined1 in_stack_ffffffffffffff45;
  undefined1 in_stack_ffffffffffffff46;
  undefined1 in_stack_ffffffffffffff47;
  FileLoc *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  string *in_stack_ffffffffffffff78;
  FileLoc *in_stack_ffffffffffffff80;
  string local_68 [32];
  undefined4 local_48;
  string local_38 [32];
  ulong local_18;
  
  local_18 = in_RDX;
  anon_unknown_146::normalizeArg(in_stack_ffffffffffffff78);
  if (*(int *)(in_RDI[0x132] + 2) == 2) {
    Error<char_const(&)[7]>(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,in_RDI);
    local_48 = 1;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffff47,
                                     CONCAT16(in_stack_ffffffffffffff46,
                                              CONCAT15(in_stack_ffffffffffffff45,
                                                       CONCAT14(in_stack_ffffffffffffff44,
                                                                CONCAT13(in_stack_ffffffffffffff43,
                                                                         CONCAT12(
                                                  in_stack_ffffffffffffff42,
                                                  CONCAT11(in_stack_ffffffffffffff41,
                                                           in_stack_ffffffffffffff40))))))),
                            (char *)in_stack_ffffffffffffff38);
    if (bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_ffffffffffffff47,
                                       CONCAT16(in_stack_ffffffffffffff46,
                                                CONCAT15(in_stack_ffffffffffffff45,
                                                         CONCAT14(in_stack_ffffffffffffff44,
                                                                  CONCAT13(in_stack_ffffffffffffff43
                                                                           ,CONCAT12(
                                                  in_stack_ffffffffffffff42,
                                                  CONCAT11(in_stack_ffffffffffffff41,
                                                           in_stack_ffffffffffffff40))))))),
                              (char *)in_stack_ffffffffffffff38);
      if (bVar1) {
        *(undefined1 *)(Options + 0xc) = 1;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffff47,
                                          CONCAT16(in_stack_ffffffffffffff46,
                                                   CONCAT15(in_stack_ffffffffffffff45,
                                                            CONCAT14(in_stack_ffffffffffffff44,
                                                                     CONCAT13(
                                                  in_stack_ffffffffffffff43,
                                                  CONCAT12(in_stack_ffffffffffffff42,
                                                           CONCAT11(in_stack_ffffffffffffff41,
                                                                    in_stack_ffffffffffffff40)))))))
                                ,(char *)in_stack_ffffffffffffff38);
        if (bVar1) {
          *(undefined1 *)(Options + 0xc) = 0;
        }
        else {
          SceneRepresentation::ErrorExitDeferred<std::__cxx11::string_const&>
                    ((SceneRepresentation *)
                     CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff48,
                     (char *)CONCAT17(in_stack_ffffffffffffff47,
                                      CONCAT16(in_stack_ffffffffffffff46,
                                               CONCAT15(in_stack_ffffffffffffff45,
                                                        CONCAT14(in_stack_ffffffffffffff44,
                                                                 CONCAT13(in_stack_ffffffffffffff43,
                                                                          CONCAT12(
                                                  in_stack_ffffffffffffff42,
                                                  CONCAT11(in_stack_ffffffffffffff41,
                                                           in_stack_ffffffffffffff40))))))),
                     in_stack_ffffffffffffff38);
        }
      }
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_ffffffffffffff47,
                                       CONCAT16(in_stack_ffffffffffffff46,
                                                CONCAT15(in_stack_ffffffffffffff45,
                                                         CONCAT14(in_stack_ffffffffffffff44,
                                                                  CONCAT13(in_stack_ffffffffffffff43
                                                                           ,CONCAT12(
                                                  in_stack_ffffffffffffff42,
                                                  CONCAT11(in_stack_ffffffffffffff41,
                                                           in_stack_ffffffffffffff40))))))),
                              (char *)in_stack_ffffffffffffff38);
      if (bVar1) {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffff47,
                                          CONCAT16(in_stack_ffffffffffffff46,
                                                   CONCAT15(in_stack_ffffffffffffff45,
                                                            CONCAT14(in_stack_ffffffffffffff44,
                                                                     CONCAT13(
                                                  in_stack_ffffffffffffff43,
                                                  CONCAT12(in_stack_ffffffffffffff42,
                                                           CONCAT11(in_stack_ffffffffffffff41,
                                                                    in_stack_ffffffffffffff40)))))))
                                ,(char *)in_stack_ffffffffffffff38);
        if (bVar1) {
          *(undefined1 *)(Options + 0xd) = 1;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_ffffffffffffff47,
                                              CONCAT16(in_stack_ffffffffffffff46,
                                                       CONCAT15(in_stack_ffffffffffffff45,
                                                                CONCAT14(in_stack_ffffffffffffff44,
                                                                         CONCAT13(
                                                  in_stack_ffffffffffffff43,
                                                  CONCAT12(in_stack_ffffffffffffff42,
                                                           CONCAT11(in_stack_ffffffffffffff41,
                                                                    in_stack_ffffffffffffff40)))))))
                                  ,(char *)in_stack_ffffffffffffff38);
          if (bVar1) {
            *(undefined1 *)(Options + 0xd) = 0;
          }
          else {
            SceneRepresentation::ErrorExitDeferred<std::__cxx11::string_const&>
                      ((SceneRepresentation *)
                       CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                       in_stack_ffffffffffffff48,
                       (char *)CONCAT17(in_stack_ffffffffffffff47,
                                        CONCAT16(in_stack_ffffffffffffff46,
                                                 CONCAT15(in_stack_ffffffffffffff45,
                                                          CONCAT14(in_stack_ffffffffffffff44,
                                                                   CONCAT13(
                                                  in_stack_ffffffffffffff43,
                                                  CONCAT12(in_stack_ffffffffffffff42,
                                                           CONCAT11(in_stack_ffffffffffffff41,
                                                                    in_stack_ffffffffffffff40)))))))
                       ,in_stack_ffffffffffffff38);
          }
        }
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffff47,
                                          CONCAT16(in_stack_ffffffffffffff46,
                                                   CONCAT15(in_stack_ffffffffffffff45,
                                                            CONCAT14(in_stack_ffffffffffffff44,
                                                                     CONCAT13(
                                                  in_stack_ffffffffffffff43,
                                                  CONCAT12(in_stack_ffffffffffffff42,
                                                           CONCAT11(in_stack_ffffffffffffff41,
                                                                    in_stack_ffffffffffffff40)))))))
                                ,(char *)in_stack_ffffffffffffff38);
        if (bVar1) {
          uVar8 = std::__cxx11::string::size();
          if (((uVar8 < 3) || (pcVar9 = (char *)std::__cxx11::string::front(), *pcVar9 != '\"')) ||
             (pcVar9 = (char *)std::__cxx11::string::back(), *pcVar9 != '\"')) {
            SceneRepresentation::ErrorExitDeferred<std::__cxx11::string_const&>
                      ((SceneRepresentation *)
                       CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                       in_stack_ffffffffffffff48,
                       (char *)CONCAT17(in_stack_ffffffffffffff47,
                                        CONCAT16(in_stack_ffffffffffffff46,
                                                 CONCAT15(in_stack_ffffffffffffff45,
                                                          CONCAT14(in_stack_ffffffffffffff44,
                                                                   CONCAT13(
                                                  in_stack_ffffffffffffff43,
                                                  CONCAT12(in_stack_ffffffffffffff42,
                                                           CONCAT11(in_stack_ffffffffffffff41,
                                                                    in_stack_ffffffffffffff40)))))))
                       ,in_stack_ffffffffffffff38);
          }
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_68,local_18);
          std::__cxx11::string::operator=((string *)(Options + 0x48),local_68);
          std::__cxx11::string::~string(local_68);
        }
        else {
          uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_ffffffffffffff47,
                                              CONCAT16(in_stack_ffffffffffffff46,
                                                       CONCAT15(in_stack_ffffffffffffff45,
                                                                CONCAT14(in_stack_ffffffffffffff44,
                                                                         CONCAT13(
                                                  in_stack_ffffffffffffff43,
                                                  CONCAT12(in_stack_ffffffffffffff42,
                                                           CONCAT11(in_stack_ffffffffffffff41,
                                                                    in_stack_ffffffffffffff40)))))))
                                  ,(char *)in_stack_ffffffffffffff38);
          if ((bool)uVar2) {
            uVar8 = std::__cxx11::string::size();
            if (((uVar8 < 3) || (pcVar9 = (char *)std::__cxx11::string::front(), *pcVar9 != '\"'))
               || (pcVar9 = (char *)std::__cxx11::string::back(), *pcVar9 != '\"')) {
              SceneRepresentation::ErrorExitDeferred<std::__cxx11::string_const&>
                        ((SceneRepresentation *)CONCAT17(uVar2,in_stack_ffffffffffffff50),
                         in_stack_ffffffffffffff48,
                         (char *)CONCAT17(in_stack_ffffffffffffff47,
                                          CONCAT16(in_stack_ffffffffffffff46,
                                                   CONCAT15(in_stack_ffffffffffffff45,
                                                            CONCAT14(in_stack_ffffffffffffff44,
                                                                     CONCAT13(
                                                  in_stack_ffffffffffffff43,
                                                  CONCAT12(in_stack_ffffffffffffff42,
                                                           CONCAT11(in_stack_ffffffffffffff41,
                                                                    in_stack_ffffffffffffff40)))))))
                         ,in_stack_ffffffffffffff38);
            }
            std::__cxx11::string::size();
            std::__cxx11::string::substr((ulong)&stack0xffffffffffffff78,local_18);
            std::__cxx11::string::operator=
                      ((string *)(Options + 0x68),(string *)&stack0xffffffffffffff78);
            std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
          }
          else {
            uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_ffffffffffffff47,
                                                CONCAT16(in_stack_ffffffffffffff46,
                                                         CONCAT15(in_stack_ffffffffffffff45,
                                                                  CONCAT14(in_stack_ffffffffffffff44
                                                                           ,CONCAT13(
                                                  in_stack_ffffffffffffff43,
                                                  CONCAT12(in_stack_ffffffffffffff42,
                                                           CONCAT11(in_stack_ffffffffffffff41,
                                                                    in_stack_ffffffffffffff40)))))))
                                    ,(char *)in_stack_ffffffffffffff38);
            if ((bool)uVar3) {
              pcVar9 = (char *)std::__cxx11::string::c_str();
              iVar7 = atoi(pcVar9);
              *(int *)(Options + 4) = iVar7;
            }
            else {
              uVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT17(uVar3,CONCAT16(in_stack_ffffffffffffff46,
                                                                 CONCAT15(in_stack_ffffffffffffff45,
                                                                          CONCAT14(
                                                  in_stack_ffffffffffffff44,
                                                  CONCAT13(in_stack_ffffffffffffff43,
                                                           CONCAT12(in_stack_ffffffffffffff42,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff41,
                                                  in_stack_ffffffffffffff40))))))),
                                      (char *)in_stack_ffffffffffffff38);
              if ((bool)uVar4) {
                uVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT17(uVar3,CONCAT16(uVar4,CONCAT15(
                                                  in_stack_ffffffffffffff45,
                                                  CONCAT14(in_stack_ffffffffffffff44,
                                                           CONCAT13(in_stack_ffffffffffffff43,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff42,
                                                  CONCAT11(in_stack_ffffffffffffff41,
                                                           in_stack_ffffffffffffff40))))))),
                                        (char *)in_stack_ffffffffffffff38);
                if ((bool)uVar5) {
                  *(undefined1 *)(Options + 0xe) = 1;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)CONCAT17(uVar3,CONCAT16(uVar4,CONCAT15(uVar5,CONCAT14(
                                                  in_stack_ffffffffffffff44,
                                                  CONCAT13(in_stack_ffffffffffffff43,
                                                           CONCAT12(in_stack_ffffffffffffff42,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff41,
                                                  in_stack_ffffffffffffff40))))))),
                                          (char *)in_stack_ffffffffffffff38);
                  if (bVar1) {
                    *(undefined1 *)(Options + 0xe) = 0;
                  }
                  else {
                    SceneRepresentation::ErrorExitDeferred<std::__cxx11::string_const&>
                              ((SceneRepresentation *)CONCAT17(uVar2,in_stack_ffffffffffffff50),
                               in_stack_ffffffffffffff48,
                               (char *)CONCAT17(uVar3,CONCAT16(uVar4,CONCAT15(uVar5,CONCAT14(bVar1,
                                                  CONCAT13(in_stack_ffffffffffffff43,
                                                           CONCAT12(in_stack_ffffffffffffff42,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff41,
                                                  in_stack_ffffffffffffff40))))))),
                               in_stack_ffffffffffffff38);
                  }
                }
              }
              else {
                uVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT17(uVar3,CONCAT16(uVar4,CONCAT15(
                                                  in_stack_ffffffffffffff45,
                                                  CONCAT14(in_stack_ffffffffffffff44,
                                                           CONCAT13(in_stack_ffffffffffffff43,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff42,
                                                  CONCAT11(in_stack_ffffffffffffff41,
                                                           in_stack_ffffffffffffff40))))))),
                                        (char *)in_stack_ffffffffffffff38);
                if ((bool)uVar5) {
                  uVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)CONCAT17(uVar3,CONCAT16(uVar4,CONCAT15(
                                                  in_stack_ffffffffffffff45,
                                                  CONCAT14(in_stack_ffffffffffffff44,
                                                           CONCAT13(uVar5,CONCAT12(
                                                  in_stack_ffffffffffffff42,
                                                  CONCAT11(in_stack_ffffffffffffff41,
                                                           in_stack_ffffffffffffff40))))))),
                                          (char *)in_stack_ffffffffffffff38);
                  if ((bool)uVar6) {
                    *(undefined1 *)(Options + 10) = 1;
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CONCAT17(uVar3,CONCAT16(uVar4,CONCAT15(
                                                  in_stack_ffffffffffffff45,
                                                  CONCAT14(in_stack_ffffffffffffff44,
                                                           CONCAT13(uVar5,CONCAT12(uVar6,CONCAT11(
                                                  in_stack_ffffffffffffff41,
                                                  in_stack_ffffffffffffff40))))))),
                                            (char *)in_stack_ffffffffffffff38);
                    if (bVar1) {
                      *(undefined1 *)(Options + 10) = 0;
                    }
                    else {
                      SceneRepresentation::ErrorExitDeferred<std::__cxx11::string_const&>
                                ((SceneRepresentation *)CONCAT17(uVar2,in_stack_ffffffffffffff50),
                                 in_stack_ffffffffffffff48,
                                 (char *)CONCAT17(uVar3,CONCAT16(uVar4,CONCAT15(
                                                  in_stack_ffffffffffffff45,
                                                  CONCAT14(in_stack_ffffffffffffff44,
                                                           CONCAT13(uVar5,CONCAT12(uVar6,CONCAT11(
                                                  bVar1,in_stack_ffffffffffffff40))))))),
                                 in_stack_ffffffffffffff38);
                    }
                  }
                }
                else {
                  SceneRepresentation::ErrorExitDeferred<std::__cxx11::string_const&>
                            ((SceneRepresentation *)CONCAT17(uVar2,in_stack_ffffffffffffff50),
                             in_stack_ffffffffffffff48,
                             (char *)CONCAT17(uVar3,CONCAT16(uVar4,CONCAT15(
                                                  in_stack_ffffffffffffff45,
                                                  CONCAT14(in_stack_ffffffffffffff44,
                                                           CONCAT13(uVar5,CONCAT12(
                                                  in_stack_ffffffffffffff42,
                                                  CONCAT11(in_stack_ffffffffffffff41,
                                                           in_stack_ffffffffffffff40))))))),
                             in_stack_ffffffffffffff38);
                }
              }
            }
          }
        }
      }
    }
    local_48 = 0;
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void ParsedScene::Option(const std::string &name, const std::string &value, FileLoc loc) {
    std::string nName = normalizeArg(name);

    VERIFY_INITIALIZED("Option");
    if (nName == "disablepixeljitter") {
        if (value == "true")
            Options->disablePixelJitter = true;
        else if (value == "false")
            Options->disablePixelJitter = false;
        else
            ErrorExitDeferred(&loc, "%s: expected \"true\" or \"false\" for option value",
                              value);
    } else if (nName == "disablewavelengthjitter") {
        if (value == "true")
            Options->disableWavelengthJitter = true;
        else if (value == "false")
            Options->disableWavelengthJitter = false;
        else
            ErrorExitDeferred(&loc, "%s: expected \"true\" or \"false\" for option value",
                              value);
    } else if (nName == "msereferenceimage") {
        if (value.size() < 3 || value.front() != '"' || value.back() != '"')
            ErrorExitDeferred(&loc, "%s: expected quoted string for option value", value);
        Options->mseReferenceImage = value.substr(1, value.size() - 2);
    } else if (nName == "msereferenceout") {
        if (value.size() < 3 || value.front() != '"' || value.back() != '"')
            ErrorExitDeferred(&loc, "%s: expected quoted string for option value", value);
        Options->mseReferenceOutput = value.substr(1, value.size() - 2);
    } else if (nName == "seed") {
        Options->seed = std::atoi(value.c_str());
    } else if (nName == "forcediffuse") {
        if (value == "true")
            Options->forceDiffuse = true;
        else if (value == "false")
            Options->forceDiffuse = false;
        else
            ErrorExitDeferred(&loc, "%s: expected \"true\" or \"false\" for option value",
                              value);
    } else if (nName == "pixelstats") {
        if (value == "true")
            Options->recordPixelStatistics = true;
        else if (value == "false")
            Options->recordPixelStatistics = false;
        else
            ErrorExitDeferred(&loc, "%s: expected \"true\" or \"false\" for option value",
                              value);
    } else
        ErrorExitDeferred(&loc, "%s: unknown option", name);
}